

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_nameMatchesAscii(ENCODING *enc,char *ptr1,char *end1,char *ptr2)

{
  while( true ) {
    if (*ptr2 == '\0') {
      return (uint)(ptr1 == end1);
    }
    if (ptr1 == end1) {
      return 0;
    }
    if (ptr1[1] != '\0') {
      return 0;
    }
    if (*ptr1 != *ptr2) break;
    ptr1 = ptr1 + 2;
    ptr2 = ptr2 + 1;
  }
  return 0;
}

Assistant:

static
int PREFIX(nameMatchesAscii)(const ENCODING *enc, const char *ptr1,
                             const char *end1, const char *ptr2)
{
  cmExpatUnused(enc);
  for (; *ptr2; ptr1 += MINBPC(enc), ptr2++) {
    if (ptr1 == end1)
      return 0;
    if (!CHAR_MATCHES(enc, ptr1, *ptr2))
      return 0;
  }
  return ptr1 == end1;
}